

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

Error __thiscall asmjit::_abi_1_10::BaseBuilder::onDetach(BaseBuilder *this,CodeHolder *code)

{
  Error EVar1;
  
  BaseBuilder_deletePasses(this);
  (this->_labelNodes).super_ZoneVectorBase._data = (void *)0x0;
  (this->_labelNodes).super_ZoneVectorBase._size = 0;
  (this->_labelNodes).super_ZoneVectorBase._capacity = 0;
  (this->_sectionNodes).super_ZoneVectorBase._data = (void *)0x0;
  (this->_sectionNodes).super_ZoneVectorBase._size = 0;
  (this->_sectionNodes).super_ZoneVectorBase._capacity = 0;
  ZoneAllocator::reset(&this->_allocator,&this->_codeZone);
  Zone::reset(&this->_codeZone,kSoft);
  Zone::reset(&this->_dataZone,kSoft);
  Zone::reset(&this->_passZone,kSoft);
  *(undefined8 *)((long)&this->_firstNode + 1) = 0;
  *(undefined8 *)((long)&this->_lastNode + 1) = 0;
  this->_cursor = (BaseNode *)0x0;
  this->_firstNode = (BaseNode *)0x0;
  EVar1 = BaseEmitter::onDetach(&this->super_BaseEmitter,code);
  return EVar1;
}

Assistant:

Error BaseBuilder::onDetach(CodeHolder* code) noexcept {
  BaseBuilder_deletePasses(this);
  _sectionNodes.reset();
  _labelNodes.reset();

  _allocator.reset(&_codeZone);
  _codeZone.reset();
  _dataZone.reset();
  _passZone.reset();

  _nodeFlags = NodeFlags::kNone;
  _cursor = nullptr;
  _firstNode = nullptr;
  _lastNode = nullptr;

  return Base::onDetach(code);
}